

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int __thiscall FBehavior::FindMapVarName(FBehavior *this,char *varname)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  piVar2 = (int *)this->Chunks;
  if (piVar2 != (int *)0x0) {
    for (; piVar2 < this->Data + this->DataSize;
        piVar2 = (int *)((long)piVar2 + (ulong)(piVar2[1] + 8))) {
      if (*piVar2 == 0x5058454d) {
        if (piVar2 == (int *)0x0) goto LAB_003b1434;
        uVar3 = (ulong)(uint)piVar2[2];
        bVar5 = uVar3 != 0;
        if (uVar3 == 0) goto LAB_003b1434;
        iVar1 = strcasecmp(varname,(char *)((long)piVar2 + (ulong)(uint)piVar2[3] + 8));
        if (iVar1 != 0) {
          uVar4 = 0;
          goto LAB_003b1404;
        }
        uVar4 = 0;
        goto LAB_003b142f;
      }
    }
  }
  iVar1 = FindStringInChunk(this,(DWORD *)0x0,varname);
  return iVar1;
  while( true ) {
    iVar1 = strcasecmp(varname,(char *)((long)piVar2 + (ulong)(uint)piVar2[(int)uVar4 + 4] + 8));
    uVar4 = uVar4 + 1;
    if (iVar1 == 0) break;
LAB_003b1404:
    if (uVar3 - 1 == uVar4) goto LAB_003b1434;
  }
  bVar5 = uVar4 < uVar3;
LAB_003b142f:
  iVar1 = (int)uVar4;
  if (!bVar5) {
LAB_003b1434:
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int FBehavior::FindMapVarName (const char *varname) const
{
	return FindStringInChunk ((DWORD *)FindChunk (MAKE_ID('M','E','X','P')), varname);
}